

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmNtk.c
# Opt level: O3

void Sfm_CreateLevel(Vec_Wec_t *vFanins,Vec_Int_t *vLevels,Vec_Str_t *vEmpty)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  int *piVar3;
  long lVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  
  if (vLevels->nSize != 0) {
    __assert_fail("Vec_IntSize(vLevels) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmNtk.c"
                  ,0x7a,"void Sfm_CreateLevel(Vec_Wec_t *, Vec_Int_t *, Vec_Str_t *)");
  }
  uVar5 = vFanins->nSize;
  if (vLevels->nCap < (int)uVar5) {
    if (vLevels->pArray == (int *)0x0) {
      piVar3 = (int *)malloc((long)(int)uVar5 << 2);
    }
    else {
      piVar3 = (int *)realloc(vLevels->pArray,(long)(int)uVar5 << 2);
    }
    vLevels->pArray = piVar3;
    if (piVar3 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    vLevels->nCap = uVar5;
  }
  if (0 < (int)uVar5) {
    memset(vLevels->pArray,0,(ulong)uVar5 * 4);
  }
  vLevels->nSize = uVar5;
  if (0 < vFanins->nSize) {
    pVVar2 = vFanins->pArray;
    lVar4 = 0;
    do {
      if (vEmpty == (Vec_Str_t *)0x0) {
        uVar5 = 1;
      }
      else {
        if (vEmpty->nSize <= lVar4) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecStr.h"
                        ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
        }
        uVar5 = (uint)(vEmpty->pArray[lVar4] == '\0');
      }
      lVar7 = (long)pVVar2[lVar4].nSize;
      if (lVar7 < 1) {
        iVar9 = vLevels->nSize;
        iVar6 = 0;
      }
      else {
        lVar8 = 0;
        iVar6 = 0;
        do {
          iVar1 = pVVar2[lVar4].pArray[lVar8];
          if (((long)iVar1 < 0) || (iVar9 = vLevels->nSize, iVar9 <= iVar1)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          if (iVar6 <= vLevels->pArray[iVar1]) {
            iVar6 = vLevels->pArray[iVar1];
          }
          lVar8 = lVar8 + 1;
        } while (lVar7 != lVar8);
      }
      if (iVar9 <= lVar4) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      vLevels->pArray[lVar4] = iVar6 + uVar5;
      lVar4 = lVar4 + 1;
    } while (lVar4 < vFanins->nSize);
  }
  return;
}

Assistant:

void Sfm_CreateLevel( Vec_Wec_t * vFanins, Vec_Int_t * vLevels, Vec_Str_t * vEmpty )
{
    Vec_Int_t * vArray;
    int i;
    assert( Vec_IntSize(vLevels) == 0 );
    Vec_IntFill( vLevels, Vec_WecSize(vFanins), 0 );
    Vec_WecForEachLevel( vFanins, vArray, i )
        Vec_IntWriteEntry( vLevels, i, Sfm_ObjLevelNew(vArray, vLevels, Sfm_ObjAddsLevelArray(vEmpty, i)) );
}